

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O1

bool Rml::InterpolateEffectProperties
               (PropertyDictionary *properties,EffectDeclarationView *d0,EffectDeclarationView *d1,
               float alpha,Element *element)

{
  EffectSpecification *pEVar1;
  EffectSpecification *pEVar2;
  size_t __n;
  Node *pNVar3;
  ulong uVar4;
  code *pcVar5;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  *this;
  ulong *puVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  PropertyMap *pPVar10;
  size_t sVar11;
  ulong uVar12;
  PropertySpecification *this_00;
  PropertyDefinition *this_01;
  Property *pPVar13;
  NodePtr pDVar14;
  EffectDeclarationView *pEVar15;
  uint8_t *puVar16;
  Property *p1;
  Property *p0;
  PropertyId id_00;
  ulong *puVar17;
  Node *pNVar18;
  bool bVar19;
  const_iterator cVar20;
  const_iterator cVar21;
  PropertyId id;
  Property p;
  PropertyId local_b1;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  *local_b0;
  float local_a4;
  NodePtr local_a0;
  PropertyDictionary *local_98;
  Element *local_90;
  PropertySpecification *local_88;
  Property local_80;
  
  pEVar1 = d0->instancer;
  pEVar2 = d1->instancer;
  local_a4 = alpha;
  local_98 = properties;
  local_90 = element;
  if (pEVar1 == (EffectSpecification *)0x0) {
    pEVar15 = d1;
    if (pEVar2 == (EffectSpecification *)0x0) {
      return false;
    }
  }
  else {
    if (pEVar2 != (EffectSpecification *)0x0) {
      if (pEVar1 == pEVar2) {
        __n = d0->type->_M_string_length;
        if ((__n == d1->type->_M_string_length) &&
           ((__n == 0 ||
            (iVar8 = bcmp((d0->type->_M_dataplus)._M_p,(d1->type->_M_dataplus)._M_p,__n), iVar8 == 0
            )))) {
          iVar8 = PropertyDictionary::GetNumProperties(d0->properties);
          iVar9 = PropertyDictionary::GetNumProperties(d1->properties);
          if ((iVar8 == iVar9) && (d0->paint_area == d1->paint_area)) {
            pPVar10 = PropertyDictionary::GetProperties(d0->properties);
            local_b0 = PropertyDictionary::GetProperties(d1->properties);
            cVar20 = robin_hood::detail::
                     Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                     ::cbegin(pPVar10);
            local_a0 = (NodePtr)pPVar10->mInfo;
            bVar19 = cVar20.mKeyVals == local_a0;
            this = local_b0;
            while( true ) {
              if (bVar19) {
                return bVar19;
              }
              puVar16 = cVar20.mInfo;
              pDVar14 = cVar20.mKeyVals;
              local_b1 = (pDVar14->mData).first;
              local_b0 = this;
              sVar11 = robin_hood::detail::
                       Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                       ::findIdx<Rml::PropertyId>(this,&local_b1);
              pNVar18 = this->mKeyVals + sVar11;
              pNVar3 = (Node *)this->mInfo;
              if (pNVar18 == pNVar3) {
                bVar7 = Assert("Incompatible decorator properties.",
                               "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                               ,0x9a);
                if (!bVar7) {
                  pcVar5 = (code *)invalidInstructionException();
                  (*pcVar5)();
                }
              }
              else {
                InterpolateProperties
                          (&local_80,&(pDVar14->mData).second,&(pNVar18->mData).second,local_a4,
                           local_90,(pDVar14->mData).second.definition);
                local_80.definition = (pDVar14->mData).second.definition;
                PropertyDictionary::SetProperty(local_98,local_b1,&local_80);
                if (local_80.source.
                    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_80.source.
                             super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                Variant::~Variant(&local_80.value);
              }
              if (pNVar18 == pNVar3) break;
              pDVar14 = pDVar14 + 1;
              uVar12 = *(ulong *)(puVar16 + 1);
              if (uVar12 == 0) {
                puVar6 = (ulong *)(puVar16 + 9);
                do {
                  puVar17 = puVar6;
                  pDVar14 = pDVar14 + 8;
                  uVar12 = *puVar17;
                  puVar6 = puVar17 + 1;
                } while (uVar12 == 0);
              }
              else {
                puVar17 = (ulong *)(puVar16 + 1);
              }
              uVar4 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              uVar12 = uVar4 >> 3 & 0x1fffffff;
              cVar20.mInfo = (uint8_t *)((long)puVar17 + uVar12);
              cVar20.mKeyVals = pDVar14 + uVar12;
              bVar19 = pDVar14 + uVar12 == local_a0;
              this = local_b0;
            }
            return bVar19;
          }
        }
      }
      return false;
    }
    pEVar15 = d0;
    if ((pEVar1 == (EffectSpecification *)0x0) || (d1->instancer != (EffectSpecification *)0x0)) {
      if (pEVar1 != (EffectSpecification *)0x0) {
        return false;
      }
      if (d1->instancer == (EffectSpecification *)0x0) {
        return false;
      }
    }
  }
  local_b0 = (Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
              *)d0;
  this_00 = EffectSpecification::GetPropertySpecification(pEVar15->instancer);
  pPVar10 = PropertyDictionary::GetProperties(pEVar15->properties);
  cVar21 = robin_hood::detail::
           Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
           ::cbegin(pPVar10);
  local_a0 = (NodePtr)pPVar10->mInfo;
  bVar19 = cVar21.mKeyVals == local_a0;
  if (!bVar19) {
    id_00 = ((cVar21.mKeyVals)->mData).first;
    local_88 = this_00;
    this_01 = PropertySpecification::GetProperty(this_00,id_00);
    if (this_01 != (PropertyDefinition *)0x0) {
      do {
        puVar16 = cVar21.mInfo;
        pDVar14 = cVar21.mKeyVals;
        p1 = &(pDVar14->mData).second;
        pPVar13 = PropertyDefinition::GetDefaultValue(this_01);
        p0 = p1;
        if ((EffectSpecification *)local_b0->mKeyVals == (EffectSpecification *)0x0) {
          p0 = pPVar13;
        }
        if (d1->instancer == (EffectSpecification *)0x0) {
          p1 = pPVar13;
        }
        InterpolateProperties(&local_80,p0,p1,local_a4,local_90,(pDVar14->mData).second.definition);
        local_80.definition = (pDVar14->mData).second.definition;
        PropertyDictionary::SetProperty(local_98,id_00,&local_80);
        if (local_80.source.
            super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.source.
                     super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        Variant::~Variant(&local_80.value);
        pDVar14 = pDVar14 + 1;
        uVar12 = *(ulong *)(puVar16 + 1);
        if (uVar12 == 0) {
          puVar6 = (ulong *)(puVar16 + 9);
          do {
            puVar17 = puVar6;
            pDVar14 = pDVar14 + 8;
            uVar12 = *puVar17;
            puVar6 = puVar17 + 1;
          } while (uVar12 == 0);
        }
        else {
          puVar17 = (ulong *)(puVar16 + 1);
        }
        uVar4 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        uVar12 = uVar4 >> 3 & 0x1fffffff;
        pDVar14 = pDVar14 + uVar12;
        bVar19 = pDVar14 == local_a0;
        if (bVar19) {
          return bVar19;
        }
        cVar21.mInfo = (uint8_t *)((long)puVar17 + uVar12);
        cVar21.mKeyVals = pDVar14;
        id_00 = (pDVar14->mData).first;
        this_01 = PropertySpecification::GetProperty(local_88,id_00);
      } while (this_01 != (PropertyDefinition *)0x0);
    }
  }
  return bVar19;
}

Assistant:

static bool InterpolateEffectProperties(PropertyDictionary& properties, const EffectDeclarationView& d0, const EffectDeclarationView& d1, float alpha,
	Element& element)
{
	if (d0 && d1)
	{
		// Both declarations are specified, check if they are compatible for interpolation.
		if (!d0.instancer || d0.instancer != d1.instancer || *d0.type != *d1.type ||
			d0.properties->GetNumProperties() != d1.properties->GetNumProperties() || d0.paint_area != d1.paint_area)
			return false;

		const auto& properties0 = d0.properties->GetProperties();
		const auto& properties1 = d1.properties->GetProperties();

		for (const auto& pair0 : properties0)
		{
			const PropertyId id = pair0.first;
			const Property& prop0 = pair0.second;

			auto it = properties1.find(id);
			if (it == properties1.end())
			{
				RMLUI_ERRORMSG("Incompatible decorator properties.");
				return false;
			}
			const Property& prop1 = it->second;

			Property p = InterpolateProperties(prop0, prop1, alpha, element, prop0.definition);
			p.definition = prop0.definition;
			properties.SetProperty(id, p);
		}
		return true;
	}
	else if ((d0 && !d1) || (!d0 && d1))
	{
		// One of the declarations is empty, interpolate against the default values of its type.
		const auto& d_filled = (d0 ? d0 : d1);

		const PropertySpecification& specification = d_filled.instancer->GetPropertySpecification();
		const PropertyMap& properties_filled = d_filled.properties->GetProperties();

		for (const auto& pair_filled : properties_filled)
		{
			const PropertyId id = pair_filled.first;
			const PropertyDefinition* underlying_definition = specification.GetProperty(id);
			if (!underlying_definition)
				return false;

			const Property& p_filled = pair_filled.second;
			const Property& p_default = *underlying_definition->GetDefaultValue();
			const Property& p_interp0 = (d0 ? p_filled : p_default);
			const Property& p_interp1 = (d1 ? p_filled : p_default);

			Property p = InterpolateProperties(p_interp0, p_interp1, alpha, element, p_filled.definition);
			p.definition = p_filled.definition;
			properties.SetProperty(id, p);
		}
		return true;
	}

	return false;
}